

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng::encode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *in,uint w,uint h,
                    LodePNGColorType colortype,uint bitdepth)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  size_t sVar4;
  uchar *in_00;
  
  sVar4 = lodepng_get_raw_size_lct(w,h,colortype,bitdepth);
  puVar1 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((ulong)((long)puVar2 - (long)puVar1) < sVar4) {
    return 0x54;
  }
  in_00 = (uchar *)0x0;
  if (puVar1 != puVar2) {
    in_00 = puVar1;
  }
  uVar3 = encode(out,in_00,w,h,colortype,bitdepth);
  return uVar3;
}

Assistant:

unsigned encode(std::vector<unsigned char>& out,
                const std::vector<unsigned char>& in, unsigned w, unsigned h,
                LodePNGColorType colortype, unsigned bitdepth) {
  if(lodepng_get_raw_size_lct(w, h, colortype, bitdepth) > in.size()) return 84;
  return encode(out, in.empty() ? 0 : &in[0], w, h, colortype, bitdepth);
}